

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Host.cpp
# Opt level: O0

StringRef llvm::sys::getHostCPUName(void)

{
  bool bVar1;
  uint local_3ec;
  uint local_3e8;
  uint Subtype;
  uint Type;
  uint Features2;
  uint Features;
  uint Model;
  uint Family;
  uint Brand_id;
  uint Vendor;
  uint MaxLeaf;
  uint EDX;
  uint ECX;
  uint EBX;
  uint EAX;
  char *local_3a8;
  uint *local_3a0;
  char *local_398;
  uint *local_390;
  char *local_388;
  uint *local_380;
  char *local_378;
  uint *local_370;
  char *local_368;
  uint *local_360;
  char *local_358;
  uint *local_350;
  char *local_348;
  uint *local_340;
  char *local_338;
  uint *local_330;
  char *local_328;
  uint *local_320;
  char *local_318;
  uint *local_310;
  char *local_308;
  uint *local_300;
  char *local_2f8;
  uint *local_2f0;
  char *local_2e8;
  uint *local_2e0;
  char *local_2d8;
  uint *local_2d0;
  char *local_2c8;
  uint *local_2c0;
  char *local_2b8;
  uint *local_2b0;
  char *local_2a8;
  uint *local_2a0;
  char *local_298;
  uint *local_290;
  char *local_288;
  uint *local_280;
  char *local_278;
  uint *local_270;
  char *local_268;
  uint *local_260;
  char *local_258;
  uint *local_250;
  char *local_248;
  uint *local_240;
  char *local_238;
  uint *local_230;
  char *local_228;
  uint *local_220;
  char *local_218;
  uint *local_210;
  char *local_208;
  uint *local_200;
  char *local_1f8;
  uint *local_1f0;
  char *local_1e8;
  uint *local_1e0;
  char *local_1d8;
  uint *local_1d0;
  char *local_1c8;
  uint *local_1c0;
  char *local_1b8;
  uint *local_1b0;
  char *local_1a8;
  uint *local_1a0;
  char *local_198;
  uint *local_190;
  char *local_188;
  uint *local_180;
  char *local_178;
  uint *local_170;
  char *local_168;
  uint *local_160;
  char *local_158;
  uint *local_150;
  char *local_148;
  uint *local_140;
  char *local_138;
  uint *local_130;
  char *local_128;
  uint *local_120;
  char *local_118;
  uint *local_110;
  char *local_108;
  uint *local_100;
  char *local_f8;
  uint *local_f0;
  char *local_e8;
  uint *local_e0;
  char *local_d8;
  uint *local_d0;
  char *local_c8;
  uint *local_c0;
  char *local_b8;
  uint *local_b0;
  char *local_a8;
  uint *local_a0;
  char *local_98;
  uint *local_90;
  char *local_88;
  uint *local_80;
  char *local_78;
  uint *local_70;
  char *local_68;
  uint *local_60;
  char *local_58;
  uint *local_50;
  char *local_48;
  uint *local_40;
  char *local_38;
  uint *local_30;
  char *local_28;
  uint *local_20;
  char *local_18;
  uint *local_10;
  
  ECX = 0;
  EDX = 0;
  MaxLeaf = 0;
  Vendor = 0;
  bVar1 = isCpuIdSupported();
  if (bVar1) {
    bVar1 = getX86CpuIDAndInfo(0,&Brand_id,&Family,&MaxLeaf,&Vendor);
    if ((bVar1) || (Brand_id == 0)) {
      local_390 = &EBX;
      local_398 = "generic";
      strlen("generic");
    }
    else {
      getX86CpuIDAndInfo(1,&ECX,&EDX,&MaxLeaf,&Vendor);
      Model = EDX & 0xff;
      Features = 0;
      Features2 = 0;
      Type = 0;
      Subtype = 0;
      detectX86FamilyModel(ECX,&Features,&Features2);
      getAvailableFeatures(MaxLeaf,Vendor,Brand_id,&Type,&Subtype);
      local_3e8 = 0;
      local_3ec = 0;
      if (Family == 0x756e6547) {
        getIntelProcessorTypeAndSubtype(Features,Features2,Model,Type,Subtype,&local_3e8,&local_3ec)
        ;
      }
      else if (Family == 0x68747541) {
        getAMDProcessorTypeAndSubtype(Features,Features2,Type,&local_3e8,&local_3ec);
      }
      if (local_3ec == 1) {
        local_380 = &EBX;
        local_388 = "nehalem";
        strlen("nehalem");
      }
      else if (local_3ec == 2) {
        local_370 = &EBX;
        local_378 = "westmere";
        strlen("westmere");
      }
      else if (local_3ec == 3) {
        local_360 = &EBX;
        local_368 = "sandybridge";
        strlen("sandybridge");
      }
      else if (local_3ec == 4) {
        local_350 = &EBX;
        local_358 = "amdfam10";
        strlen("amdfam10");
      }
      else if (local_3ec == 5) {
        local_340 = &EBX;
        local_348 = "amdfam10";
        strlen("amdfam10");
      }
      else if (local_3ec == 6) {
        local_330 = &EBX;
        local_338 = "amdfam10";
        strlen("amdfam10");
      }
      else if (local_3ec == 7) {
        local_320 = &EBX;
        local_328 = "bdver1";
        strlen("bdver1");
      }
      else if (local_3ec == 8) {
        local_310 = &EBX;
        local_318 = "bdver2";
        strlen("bdver2");
      }
      else if (local_3ec == 9) {
        local_300 = &EBX;
        local_308 = "bdver3";
        strlen("bdver3");
      }
      else if (local_3ec == 10) {
        local_2f0 = &EBX;
        local_2f8 = "bdver4";
        strlen("bdver4");
      }
      else if (local_3ec == 0xb) {
        local_2e0 = &EBX;
        local_2e8 = "znver1";
        strlen("znver1");
      }
      else if (local_3ec == 0xc) {
        local_2d0 = &EBX;
        local_2d8 = "ivybridge";
        strlen("ivybridge");
      }
      else if (local_3ec == 0xd) {
        local_2c0 = &EBX;
        local_2c8 = "haswell";
        strlen("haswell");
      }
      else if (local_3ec == 0xe) {
        local_2b0 = &EBX;
        local_2b8 = "broadwell";
        strlen("broadwell");
      }
      else if (local_3ec == 0xf) {
        local_2a0 = &EBX;
        local_2a8 = "skylake";
        strlen("skylake");
      }
      else if (local_3ec == 0x10) {
        local_290 = &EBX;
        local_298 = "skylake-avx512";
        strlen("skylake-avx512");
      }
      else if (local_3ec == 0x11) {
        local_280 = &EBX;
        local_288 = "cannonlake";
        strlen("cannonlake");
      }
      else if (local_3ec == 0x12) {
        local_270 = &EBX;
        local_278 = "core2";
        strlen("core2");
      }
      else if (local_3ec == 0x13) {
        local_260 = &EBX;
        local_268 = "penryn";
        strlen("penryn");
      }
      else if (local_3ec == 0x14) {
        local_250 = &EBX;
        local_258 = "k6";
        strlen("k6");
      }
      else if (local_3ec == 0x15) {
        local_240 = &EBX;
        local_248 = "k6-2";
        strlen("k6-2");
      }
      else if (local_3ec == 0x16) {
        local_230 = &EBX;
        local_238 = "k6-3";
        strlen("k6-3");
      }
      else if (local_3ec == 0x17) {
        local_220 = &EBX;
        local_228 = "geode";
        strlen("geode");
      }
      else if (local_3e8 == 1) {
        local_210 = &EBX;
        local_218 = "bonnell";
        strlen("bonnell");
      }
      else if (local_3e8 == 2) {
        local_200 = &EBX;
        local_208 = "core2";
        strlen("core2");
      }
      else if (local_3e8 == 3) {
        local_1f0 = &EBX;
        local_1f8 = "nehalem";
        strlen("nehalem");
      }
      else if (local_3e8 == 4) {
        local_1e0 = &EBX;
        local_1e8 = "amdfam10";
        strlen("amdfam10");
      }
      else if (local_3e8 == 5) {
        local_1d0 = &EBX;
        local_1d8 = "bdver1";
        strlen("bdver1");
      }
      else if (local_3e8 == 6) {
        local_1c0 = &EBX;
        local_1c8 = "silvermont";
        strlen("silvermont");
      }
      else if (local_3e8 == 7) {
        local_1b0 = &EBX;
        local_1b8 = "knl";
        strlen("knl");
      }
      else if (local_3e8 == 8) {
        local_1a0 = &EBX;
        local_1a8 = "btver1";
        strlen("btver1");
      }
      else if (local_3e8 == 9) {
        local_190 = &EBX;
        local_198 = "btver2";
        strlen("btver2");
      }
      else if (local_3e8 == 10) {
        local_180 = &EBX;
        local_188 = "znver1";
        strlen("znver1");
      }
      else if (local_3e8 == 0xb) {
        local_170 = &EBX;
        local_178 = "knm";
        strlen("knm");
      }
      else if (local_3e8 == 0xc) {
        local_160 = &EBX;
        local_168 = "i386";
        strlen("i386");
      }
      else if (local_3e8 == 0xd) {
        local_150 = &EBX;
        local_158 = "i486";
        strlen("i486");
      }
      else if (local_3e8 == 0xe) {
        local_140 = &EBX;
        local_148 = "pentium";
        strlen("pentium");
      }
      else if (local_3e8 == 0xf) {
        local_130 = &EBX;
        local_138 = "pentium-mmx";
        strlen("pentium-mmx");
      }
      else if (local_3e8 == 0x10) {
        local_120 = &EBX;
        local_128 = "pentiumpro";
        strlen("pentiumpro");
      }
      else if (local_3e8 == 0x11) {
        local_110 = &EBX;
        local_118 = "pentium2";
        strlen("pentium2");
      }
      else if (local_3e8 == 0x12) {
        local_100 = &EBX;
        local_108 = "pentium3";
        strlen("pentium3");
      }
      else if (local_3e8 == 0x13) {
        local_f0 = &EBX;
        local_f8 = "pentium4";
        strlen("pentium4");
      }
      else if (local_3e8 == 0x14) {
        local_e0 = &EBX;
        local_e8 = "pentium-m";
        strlen("pentium-m");
      }
      else if (local_3e8 == 0x15) {
        local_d0 = &EBX;
        local_d8 = "yonah";
        strlen("yonah");
      }
      else if (local_3e8 == 0x16) {
        local_c0 = &EBX;
        local_c8 = "nocona";
        strlen("nocona");
      }
      else if (local_3e8 == 0x17) {
        local_b0 = &EBX;
        local_b8 = "prescott";
        strlen("prescott");
      }
      else if (local_3e8 == 0x18) {
        local_a0 = &EBX;
        local_a8 = "i486";
        strlen("i486");
      }
      else if (local_3e8 == 0x19) {
        local_90 = &EBX;
        local_98 = "pentium";
        strlen("pentium");
      }
      else if (local_3e8 == 0x1a) {
        local_80 = &EBX;
        local_88 = "athlon";
        strlen("athlon");
      }
      else if (local_3e8 == 0x1b) {
        local_70 = &EBX;
        local_78 = "athlon-xp";
        strlen("athlon-xp");
      }
      else if (local_3e8 == 0x1c) {
        local_60 = &EBX;
        local_68 = "k8";
        strlen("k8");
      }
      else if (local_3e8 == 0x1d) {
        local_50 = &EBX;
        local_58 = "k8-sse3";
        strlen("k8-sse3");
      }
      else if (local_3e8 == 0x1e) {
        local_40 = &EBX;
        local_48 = "goldmont";
        strlen("goldmont");
      }
      else if (local_3e8 == 0x1f) {
        local_30 = &EBX;
        local_38 = "goldmont-plus";
        strlen("goldmont-plus");
      }
      else if (local_3e8 == 0x20) {
        local_20 = &EBX;
        local_28 = "tremont";
        strlen("tremont");
      }
      else {
        local_10 = &EBX;
        local_18 = "generic";
        strlen("generic");
      }
    }
  }
  else {
    local_3a0 = &EBX;
    local_3a8 = "generic";
    strlen("generic");
  }
  return _EBX;
}

Assistant:

StringRef sys::getHostCPUName() {
  unsigned EAX = 0, EBX = 0, ECX = 0, EDX = 0;
  unsigned MaxLeaf, Vendor;

#if defined(__GNUC__) || defined(__clang__)
  //FIXME: include cpuid.h from clang or copy __get_cpuid_max here
  // and simplify it to not invoke __cpuid (like cpu_model.c in
  // compiler-rt/lib/builtins/cpu_model.c?
  // Opting for the second option.
  if(!isCpuIdSupported())
    return "generic";
#endif
  if (getX86CpuIDAndInfo(0, &MaxLeaf, &Vendor, &ECX, &EDX) || MaxLeaf < 1)
    return "generic";
  getX86CpuIDAndInfo(0x1, &EAX, &EBX, &ECX, &EDX);

  unsigned Brand_id = EBX & 0xff;
  unsigned Family = 0, Model = 0;
  unsigned Features = 0, Features2 = 0;
  detectX86FamilyModel(EAX, &Family, &Model);
  getAvailableFeatures(ECX, EDX, MaxLeaf, &Features, &Features2);

  unsigned Type = 0;
  unsigned Subtype = 0;

  if (Vendor == SIG_INTEL) {
    getIntelProcessorTypeAndSubtype(Family, Model, Brand_id, Features,
                                    Features2, &Type, &Subtype);
  } else if (Vendor == SIG_AMD) {
    getAMDProcessorTypeAndSubtype(Family, Model, Features, &Type, &Subtype);
  }

  // Check subtypes first since those are more specific.
#define X86_CPU_SUBTYPE(ARCHNAME, ENUM) \
  if (Subtype == X86::ENUM) \
    return ARCHNAME;
#include "llvm/Support/X86TargetParser.def"

  // Now check types.
#define X86_CPU_TYPE(ARCHNAME, ENUM) \
  if (Type == X86::ENUM) \
    return ARCHNAME;
#include "llvm/Support/X86TargetParser.def"

  return "generic";
}